

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_sort(lua_State *L)

{
  MSize idx;
  lua_State *L_00;
  GCtab *in_RDI;
  int32_t n;
  GCtab *t;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  lua_State *in_stack_fffffffffffffff0;
  
  L_00 = (lua_State *)lj_lib_checktab(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  idx = lj_tab_len(in_RDI);
  lua_settop(L_00,idx);
  if (*(int *)(*(long *)&in_RDI->metatable + 0xc) != -1) {
    lj_lib_checkfunc(L_00,idx);
  }
  auxsort(L_00,idx,in_stack_ffffffffffffffe8);
  return 0;
}

Assistant:

LJLIB_CF(table_sort)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n = (int32_t)lj_tab_len(t);
  lua_settop(L, 2);
  if (!tvisnil(L->base+1))
    lj_lib_checkfunc(L, 2);
  auxsort(L, 1, n);
  return 0;
}